

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::abstract_value<int>::abstract_value(abstract_value<int> *this,int *t)

{
  Value *in_RSI;
  undefined8 *in_RDI;
  
  Value::Value(in_RSI);
  *in_RDI = &PTR__abstract_value_001b4710;
  std::shared_ptr<int>::shared_ptr((shared_ptr<int> *)0x1781b7);
  in_RDI[5] = in_RSI;
  *(undefined1 *)(in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 0x31) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 7));
  std::__cxx11::string::string((string *)(in_RDI + 0xb));
  return;
}

Assistant:

abstract_value(T* t)
                    : m_store(t)
            {
            }